

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O3

int __thiscall CLayerTiles::BrushGrab(CLayerTiles *this,CLayerGroup *pBrush,CUIRect Rect)

{
  int w;
  int h;
  int iVar1;
  CLayerTiles *this_00;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  RECTi local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.x = (int)(Rect.x * 0.03125);
  local_40.y = (int)(Rect.y * 0.03125);
  local_40.w = (int)((Rect.w + Rect.x + 31.0) * 0.03125) - local_40.x;
  local_40.h = (int)((Rect.h + Rect.y + 31.0) * 0.03125) - local_40.y;
  Clamp(this,&local_40);
  h = local_40.h;
  w = local_40.w;
  iVar1 = 0;
  if (local_40.h != 0 && local_40.w != 0) {
    this_00 = (CLayerTiles *)operator_new(0x80);
    CLayerTiles(this_00,w,h);
    (this_00->super_CLayer).m_pEditor = (this->super_CLayer).m_pEditor;
    this_00->m_Image = this->m_Image;
    iVar1 = this->m_Game;
    this_00->m_Texture = (CTextureHandle)(this->m_Texture).m_Id;
    this_00->m_Game = iVar1;
    CLayerGroup::AddLayer(pBrush,(CLayer *)this_00);
    if (0 < h) {
      iVar2 = 0;
      iVar1 = local_40.y;
      do {
        if (0 < w) {
          lVar3 = 0;
          do {
            this_00->m_pTiles[(long)this_00->m_Width * (long)iVar2 + lVar3] =
                 this->m_pTiles[(long)this->m_Width * (long)iVar1 + (long)local_40.x + lVar3];
            lVar3 = lVar3 + 1;
          } while (w != (int)lVar3);
        }
        iVar2 = iVar2 + 1;
        iVar1 = iVar1 + 1;
      } while (iVar2 != h);
    }
    s_lastBrushX = -1;
    s_lastBrushY = -1;
    iVar1 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CLayerTiles::BrushGrab(CLayerGroup *pBrush, CUIRect Rect)
{
	RECTi r;
	Convert(Rect, &r);
	Clamp(&r);

	if(!r.w || !r.h)
		return 0;

	// create new layers
	CLayerTiles *pGrabbed = new CLayerTiles(r.w, r.h);
	pGrabbed->m_pEditor = m_pEditor;
	pGrabbed->m_Texture = m_Texture;
	pGrabbed->m_Image = m_Image;
	pGrabbed->m_Game = m_Game;
	pBrush->AddLayer(pGrabbed);

	// copy the tiles
	for(int y = 0; y < r.h; y++)
		for(int x = 0; x < r.w; x++)
			pGrabbed->m_pTiles[y*pGrabbed->m_Width+x] = m_pTiles[(r.y+y)*m_Width+(r.x+x)];

	s_lastBrushX = -1;
	s_lastBrushY = -1;
	return 1;
}